

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

RTCTraversable rtcGetSceneTraversable(RTCScene hscene)

{
  Scene *pSVar1;
  undefined8 *puVar2;
  allocator local_49;
  string local_48 [32];
  
  if (hscene == (RTCScene)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_48,"invalid argument",&local_49);
    *puVar2 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar2 + 1) = 2;
    std::__cxx11::string::string((string *)(puVar2 + 2),local_48);
    __cxa_throw(puVar2,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  pSVar1 = embree::Scene::getTraversable((Scene *)hscene);
  if (pSVar1 != (Scene *)0x0) {
    return (RTCTraversable)pSVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            (local_48,"Traversable is NULL. The scene has to be committed first.",&local_49);
  *puVar2 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar2 + 1) = 3;
  std::__cxx11::string::string((string *)(puVar2 + 2),local_48);
  __cxa_throw(puVar2,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API RTCTraversable rtcGetSceneTraversable(RTCScene hscene)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcGetSceneTraversable);
    RTC_VERIFY_HANDLE(hscene);
    RTCTraversable traversable = (RTCTraversable)scene->getTraversable();
    if (!traversable)
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"Traversable is NULL. The scene has to be committed first.");
    return traversable;
    RTC_CATCH_END2(scene);
    return (RTCTraversable)nullptr;
  }